

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,StringTree *params_4,ArrayPtr<const_char> *params_5,
          String *params_6,ArrayPtr<const_char> *params_7,ArrayPtr<const_char> *params_8,
          ArrayPtr<const_char> *params_9,StringTree *params_10,ArrayPtr<const_char> *params_11)

{
  Branch *pBVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Branch *pBVar4;
  char *pos;
  long lVar5;
  long lVar6;
  long lVar7;
  size_t elementCount;
  size_t local_c0;
  undefined1 auStack_b8 [16];
  size_t local_a8;
  char *local_a0;
  char *local_98;
  long local_90;
  undefined1 local_88 [16];
  size_t local_78;
  char *local_70;
  char *local_68;
  String local_60;
  StringTree *local_48;
  ArrayPtr<const_char> *local_40;
  StringTree *local_38;
  
  lVar6 = 0;
  lVar7 = 0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  *(undefined1 (*) [16])&(__return_storage_ptr__->text).content.disposer = (undefined1  [16])0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_c0 = this->size_;
  auStack_b8._0_8_ = (params->text).content.ptr;
  auStack_b8._8_8_ = params_1->size_;
  local_a8 = params_2->size_;
  local_a0 = params_3->ptr;
  local_98 = (params_4->text).content.ptr;
  lVar5 = 0;
  local_90 = params_5->size_ - 1;
  if (params_5->size_ == 0) {
    local_90 = lVar5;
  }
  local_88._0_8_ = (params_6->content).size_;
  local_88._8_8_ = params_7->size_;
  local_78 = params_8->size_;
  local_70 = params_9->ptr;
  local_68 = (params_10->text).content.ptr;
  do {
    lVar6 = lVar6 + *(long *)(auStack_b8 + lVar5 * 8 + -8);
    lVar7 = lVar7 + *(long *)(auStack_b8 + lVar5 * 8);
    lVar5 = lVar5 + 2;
  } while (lVar5 != 0xc);
  __return_storage_ptr__->size_ = lVar7 + lVar6;
  lVar5 = 0;
  local_c0 = 0;
  local_a0 = (char *)0x0;
  local_90 = 0;
  local_70 = (char *)0x0;
  lVar6 = 0;
  lVar7 = 0;
  do {
    lVar6 = lVar6 + *(long *)(auStack_b8 + lVar5 * 8 + -8);
    lVar7 = lVar7 + *(long *)(auStack_b8 + lVar5 * 8);
    lVar5 = lVar5 + 2;
  } while (lVar5 != 0xc);
  local_38 = this;
  heapString(&local_60,lVar7 + lVar6);
  (__return_storage_ptr__->text).content.ptr = local_60.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_60.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_60.content.disposer;
  local_c0 = 1;
  lVar6 = 0;
  lVar7 = 0;
  auStack_b8 = (undefined1  [16])0x0;
  lVar5 = 0;
  local_a8 = 0;
  local_a0 = (char *)0x1;
  local_98 = (char *)0x0;
  local_90 = 1;
  local_88 = (undefined1  [16])0x0;
  local_78 = 0;
  local_70 = (char *)0x1;
  local_68 = (char *)0x0;
  do {
    lVar6 = lVar6 + *(long *)(auStack_b8 + lVar5 * 8 + -8);
    lVar7 = lVar7 + *(long *)(auStack_b8 + lVar5 * 8);
    lVar5 = lVar5 + 2;
  } while (lVar5 != 0xc);
  elementCount = lVar7 + lVar6;
  local_48 = (StringTree *)params_3;
  local_40 = params_2;
  pBVar4 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,elementCount,elementCount,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      construct,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      destruct);
  local_60.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar1 = (__return_storage_ptr__->branches).ptr;
  local_60.content.ptr = (char *)pBVar4;
  local_60.content.size_ = elementCount;
  if (pBVar1 != (Branch *)0x0) {
    sVar2 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar3 = (__return_storage_ptr__->branches).disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pBVar1,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = pBVar4;
  (__return_storage_ptr__->branches).size_ = elementCount;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,local_38,(ArrayPtr<const_char> *)params,params_1,local_40,
             local_48,(ArrayPtr<const_char> *)params_4,(String *)params_5,
             (ArrayPtr<const_char> *)params_6,params_7,params_8,(StringTree *)params_9,
             (ArrayPtr<const_char> *)params_10);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}